

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::line_end(Fl_Input_ *this,int i)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char buf [1024];
  wchar_t local_438 [258];
  
  bVar1 = (this->super_Fl_Widget).type_;
  if ((bVar1 & 7) == 4) {
    uVar7 = (ulong)(uint)i;
    if ((bVar1 & 0x10) == 0) {
      uVar4 = (ulong)(uint)this->size_;
      if (i < this->size_) {
        uVar7 = (ulong)i;
        do {
          local_438[0] = L'\0';
          uVar2 = fl_utf8decode(this->value_ + uVar7,this->value_ + (int)uVar4,local_438);
          if (uVar2 == 10) break;
          uVar7 = uVar7 + 1;
          uVar4 = (ulong)this->size_;
        } while ((long)uVar7 < (long)uVar4);
      }
    }
    else {
      uVar4 = uVar7;
      do {
        uVar4 = uVar4 - 1;
        uVar6 = (uint)uVar7;
        uVar2 = i >> 0x1f & i;
        if ((int)uVar6 < 1) break;
        local_438[0] = L'\0';
        uVar3 = fl_utf8decode(this->value_ + uVar4,this->value_ + this->size_,local_438);
        uVar7 = (ulong)(uVar6 - 1);
        uVar2 = uVar6;
      } while (uVar3 != 10);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
      pcVar5 = this->value_ + (int)uVar2;
      do {
        pcVar5 = expand(this,pcVar5,(char *)local_438);
        uVar2 = (int)pcVar5 - *(int *)&this->value_;
        uVar7 = (ulong)uVar2;
        pcVar5 = pcVar5 + 1;
      } while ((int)uVar2 < i);
    }
  }
  else {
    uVar7 = (ulong)(uint)this->size_;
  }
  return (int)uVar7;
}

Assistant:

int Fl_Input_::line_end(int i) const {
  if (input_type() != FL_MULTILINE_INPUT) return size();

  if (wrap()) {
    // go to the start of the paragraph:
    int j = i;
    while (j > 0 && index(j-1) != '\n') j--;
    // now measure lines until we get past i, end of that line is real eol:
    setfont();
    for (const char* p=value()+j; ;) {
      char buf[MAXBUF];
      p = expand(p, buf);
      int k = (int) (p-value());
      if (k >= i) return k;
      p++;
    }
  } else {
    while (i < size() && index(i) != '\n') i++;
    return i;
  }
}